

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXSpectrum.cpp
# Opt level: O2

void __thiscall
Sinclair::ZXSpectrum::ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)0>::run_for
          (ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)0> *this,Cycles cycles)

{
  long lVar1;
  
  CPU::Z80::
  Processor<Sinclair::ZXSpectrum::ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)0>,_false,_false>
  ::run_for(&this->z80_,(HalfCycles)((long)cycles.super_WrappedInt<Cycles>.length_ * 2));
  lVar1 = (this->duration_to_press_enter_).super_WrappedInt<Cycles>.length_;
  if (0 < lVar1) {
    if (lVar1 < (long)cycles.super_WrappedInt<Cycles>.length_) {
      (this->duration_to_press_enter_).super_WrappedInt<Cycles>.length_ = 0;
      ZX::Keyboard::Keyboard::set_key_state(&this->keyboard_,0x601,false);
      return;
    }
    (this->duration_to_press_enter_).super_WrappedInt<Cycles>.length_ =
         lVar1 - (long)cycles.super_WrappedInt<Cycles>.length_;
  }
  return;
}

Assistant:

void run_for(const Cycles cycles) override {
			z80_.run_for(cycles);

			// Use this very broad timing base for the automatic enter depression.
			// It's not worth polluting the main loop.
			if(duration_to_press_enter_ > Cycles(0)) {
				if(duration_to_press_enter_ < cycles) {
					duration_to_press_enter_ = Cycles(0);
					keyboard_.set_key_state(ZX::Keyboard::KeyEnter, false);
				} else {
					duration_to_press_enter_ -= cycles;
				}
			}
		}